

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::ShiftRight(Var aLeft,Var aRight)

{
  int32 iVar1;
  uint32 uVar2;
  
  iVar1 = ToInt32(aLeft);
  uVar2 = ToUInt32(aRight);
  return (Var)((ulong)(uint)(iVar1 >> ((byte)uVar2 & 0x1f)) | 0x1000000000000);
}

Assistant:

Var TaggedInt::ShiftRight(Var aLeft, Var aRight)
    {
        //
        // If aLeft was an Int31 coming in, then the result must always be an Int31 going out because
        // shifting right only makes value smaller. Therefore, we may call ToVarUnchecked()
        // directly.
        //

        int nValue      = ToInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return ToVarUnchecked(nValue >> (nShift & 0x1F));
    }